

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::abc::gaf(abc *this,vec3 *wh,vec3 *wi,vec3 *wo)

{
  float fVar1;
  float_t fVar2;
  float fVar3;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float_t G1o;
  float local_2c;
  vec3 *pvStack_28;
  float_t G1i;
  vec3 *wo_local;
  vec3 *wi_local;
  vec3 *wh_local;
  abc *this_local;
  
  G1o = 1.0;
  fVar3 = wh->z;
  fVar1 = wi->z;
  pvStack_28 = wo;
  wo_local = wi;
  wi_local = wh;
  wh_local = (vec3 *)this;
  fVar2 = dot(wh,wi);
  local_34 = ((fVar3 * fVar1) / fVar2) * 2.0;
  local_2c = min<float>(&G1o,&local_34);
  local_3c = 1.0;
  fVar3 = wi_local->z;
  fVar1 = pvStack_28->z;
  fVar2 = dot(wi_local,pvStack_28);
  local_40 = ((fVar3 * fVar1) / fVar2) * 2.0;
  local_38 = min<float>(&local_3c,&local_40);
  fVar3 = min<float>(&local_2c,&local_38);
  return fVar3;
}

Assistant:

float_t abc::gaf(const vec3 &wh, const vec3 &wi, const vec3 &wo) const
{
	float_t G1i = min((float_t)1, (float_t)2 * (wh.z * wi.z / dot(wh, wi)));
	float_t G1o = min((float_t)1, (float_t)2 * (wh.z * wo.z / dot(wh, wo)));

	return min(G1i, G1o);
}